

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

int secp256k1_ge_eq_var(secp256k1_ge *a,secp256k1_ge *b)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  secp256k1_fe local_58;
  
  iVar2 = 0;
  if ((a->infinity == b->infinity) && (iVar2 = 1, a->infinity == 0)) {
    uVar1 = (a->x).n[4];
    uVar4 = (uVar1 >> 0x30) * 0x1000003d1 + (a->x).n[0];
    uVar5 = (uVar4 >> 0x34) + (a->x).n[1];
    uVar6 = (uVar5 >> 0x34) + (a->x).n[2];
    uVar7 = (uVar6 >> 0x34) + (a->x).n[3];
    local_58.n[0] = ((b->x).n[0] - (uVar4 & 0xfffffffffffff)) + 0x3ffffbfffff0bc;
    local_58.n[1] = ((b->x).n[1] - (uVar5 & 0xfffffffffffff)) + 0x3ffffffffffffc;
    local_58.n[2] = ((b->x).n[2] - (uVar6 & 0xfffffffffffff)) + 0x3ffffffffffffc;
    local_58.n[3] = ((b->x).n[3] - (uVar7 & 0xfffffffffffff)) + 0x3ffffffffffffc;
    local_58.n[4] = ((b->x).n[4] - ((uVar7 >> 0x34) + (uVar1 & 0xffffffffffff))) + 0x3fffffffffffc;
    iVar2 = secp256k1_fe_impl_normalizes_to_zero(&local_58);
    iVar3 = 0;
    if (iVar2 != 0) {
      uVar1 = (a->y).n[4];
      uVar4 = (uVar1 >> 0x30) * 0x1000003d1 + (a->y).n[0];
      uVar5 = (uVar4 >> 0x34) + (a->y).n[1];
      uVar6 = (uVar5 >> 0x34) + (a->y).n[2];
      uVar7 = (uVar6 >> 0x34) + (a->y).n[3];
      local_58.n[0] = ((b->y).n[0] - (uVar4 & 0xfffffffffffff)) + 0x3ffffbfffff0bc;
      local_58.n[1] = ((b->y).n[1] - (uVar5 & 0xfffffffffffff)) + 0x3ffffffffffffc;
      local_58.n[2] = ((b->y).n[2] - (uVar6 & 0xfffffffffffff)) + 0x3ffffffffffffc;
      local_58.n[3] = ((b->y).n[3] - (uVar7 & 0xfffffffffffff)) + 0x3ffffffffffffc;
      local_58.n[4] = ((b->y).n[4] - ((uVar7 >> 0x34) + (uVar1 & 0xffffffffffff))) + 0x3fffffffffffc
      ;
      iVar3 = secp256k1_fe_impl_normalizes_to_zero(&local_58);
    }
    return iVar3;
  }
  return iVar2;
}

Assistant:

static int secp256k1_ge_eq_var(const secp256k1_ge *a, const secp256k1_ge *b) {
    secp256k1_fe tmp;
    SECP256K1_GE_VERIFY(a);
    SECP256K1_GE_VERIFY(b);

    if (a->infinity != b->infinity) return 0;
    if (a->infinity) return 1;

    tmp = a->x;
    secp256k1_fe_normalize_weak(&tmp);
    if (!secp256k1_fe_equal(&tmp, &b->x)) return 0;

    tmp = a->y;
    secp256k1_fe_normalize_weak(&tmp);
    if (!secp256k1_fe_equal(&tmp, &b->y)) return 0;

    return 1;
}